

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

uchar * __thiscall
CVmRun::new_and_store_r0(CVmRun *this,uchar *pc,uint metaclass_idx,uint argc,int is_transient)

{
  vm_obj_id_t obj_00;
  undefined4 in_ECX;
  undefined4 in_EDX;
  CVmMetaTable *in_RSI;
  uint in_R8D;
  vm_obj_id_t obj;
  vm_obj_id_t in_stack_ffffffffffffffdc;
  uint in_stack_ffffffffffffffe0;
  
  obj_00 = CVmMetaTable::create_from_stack
                     (in_RSI,(uchar **)CONCAT44(in_EDX,in_ECX),in_R8D,in_stack_ffffffffffffffe0);
  if (obj_00 == 0) {
    vm_val_t::set_nil(&r0_);
  }
  else {
    vm_val_t::set_obj(&r0_,obj_00);
    if (in_R8D != 0) {
      CVmObjTable::set_obj_transient
                ((CVmObjTable *)CONCAT44(in_R8D,obj_00),in_stack_ffffffffffffffdc);
    }
  }
  return (uchar *)in_RSI;
}

Assistant:

const uchar *CVmRun::new_and_store_r0(VMG_ const uchar *pc,
                                      uint metaclass_idx, uint argc,
                                      int is_transient)
{
    vm_obj_id_t obj;
    
    /* create the object */
    obj = G_meta_table->create_from_stack(vmg_ &pc, metaclass_idx, argc);

    /* if we got a valid object, store a reference to it in R0 */
    if (obj != VM_INVALID_OBJ)
    {
        /* set the object return value */
        r0_.set_obj(obj);

        /* make the object transient if desired */
        if (is_transient)
            G_obj_table->set_obj_transient(obj);
    }
    else
    {
        /* failed - return nil */
        r0_.set_nil();
    }

    /* return the new instruction pointer */
    return pc;
}